

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall embree::SceneGraph::PlyParser::import(PlyParser *this)

{
  undefined8 uVar1;
  BBox1f time_range;
  ulong uVar2;
  long *plVar3;
  _func_int **pp_Var4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  reference pvVar7;
  unsigned_long *puVar8;
  Vec3fa *pVVar9;
  const_reference pvVar10;
  mapped_type *pmVar11;
  size_type sVar12;
  const_reference pvVar13;
  Node *in_RDI;
  size_t k;
  size_t i2;
  size_t i1;
  size_t i0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *face;
  size_t j;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *polygons;
  Element *faces;
  size_t i_4;
  vector<float,_std::allocator<float>_> *posz;
  vector<float,_std::allocator<float>_> *posy;
  vector<float,_std::allocator<float>_> *posx;
  Element *vertices;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh_o;
  Ref<embree::SceneGraph::MaterialNode> material;
  size_t i_3;
  size_t i_2;
  Vec3fa *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  value_type *in_stack_fffffffffffffab8;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *in_stack_fffffffffffffac0;
  size_t in_stack_fffffffffffffac8;
  string *in_stack_fffffffffffffad0;
  OBJMaterial *in_stack_fffffffffffffad8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  value_type vVar14;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffb50;
  TriangleMeshNode *in_stack_fffffffffffffb58;
  float in_stack_fffffffffffffb60;
  float in_stack_fffffffffffffb64;
  Triangle local_394;
  ulong local_388;
  value_type local_380;
  value_type local_378;
  value_type local_370;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_368;
  ulong local_360;
  allocator local_351;
  string local_350 [32];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_330;
  allocator local_321;
  string local_320 [32];
  mapped_type *local_300;
  ulong local_2f8;
  allocator local_2e9;
  string local_2e8 [32];
  mapped_type *local_2c8;
  allocator local_2b9;
  string local_2b8 [32];
  mapped_type *local_298;
  allocator local_289;
  string local_288 [32];
  mapped_type *local_268;
  allocator local_259;
  string local_258 [32];
  mapped_type *local_238;
  undefined1 local_229;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  undefined4 uStack_21c;
  long *local_218;
  _func_int **local_210;
  undefined1 local_205;
  allocator local_1f1;
  string local_1f0 [32];
  long *local_1d0 [3];
  long *local_1b8;
  long **local_1b0;
  long **local_1a8;
  long **local_1a0;
  undefined4 *local_198;
  undefined4 *local_190;
  undefined4 *local_188;
  _func_int **local_180;
  _func_int ***local_178;
  long **local_170;
  long **local_160;
  _func_int ***local_150;
  _func_int ***local_148;
  _func_int ***local_140;
  _func_int ***local_138;
  _func_int ***local_130;
  ulong local_128;
  reference local_120;
  size_type local_118;
  reference local_110;
  size_type local_108;
  reference local_100;
  size_type local_f8;
  reference local_f0;
  _func_int ***local_e8;
  _func_int ***local_d8;
  ulong local_c8;
  ulong local_c0;
  Vec3fa *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  reference local_90;
  ulong local_88;
  reference local_80;
  Vec3fa *local_78;
  Vec3fa *local_70;
  size_t local_68;
  Vec3fa *local_60;
  reference local_58;
  unsigned_long local_50 [2];
  ulong local_40;
  ulong local_38;
  reference local_30;
  ulong local_28;
  Vec3fa *local_20;
  Vec3fa *local_18;
  _func_int **local_10;
  
  plVar3 = (long *)MaterialNode::operator_new(0x4b2064);
  local_205 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"",&local_1f1);
  OBJMaterial::OBJMaterial(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  local_205 = 0;
  local_1b0 = local_1d0;
  local_1b8 = plVar3;
  local_1d0[0] = plVar3;
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x10))();
  }
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  pp_Var4 = (_func_int **)operator_new(0xd8);
  local_229 = 1;
  local_1a0 = &local_218;
  local_1a8 = local_1d0;
  local_218 = local_1d0[0];
  if (local_1d0[0] != (long *)0x0) {
    (**(code **)(*local_1d0[0] + 0x10))();
  }
  local_224 = 0;
  local_228 = 0x3f800000;
  local_188 = &local_220;
  local_190 = &local_224;
  local_198 = &local_228;
  local_220 = 0;
  uStack_21c = 0x3f800000;
  time_range.upper = in_stack_fffffffffffffb64;
  time_range.lower = in_stack_fffffffffffffb60;
  TriangleMeshNode::TriangleMeshNode
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,time_range,
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_229 = 0;
  local_178 = &local_210;
  local_180 = pp_Var4;
  local_210 = pp_Var4;
  if (pp_Var4 != (_func_int **)0x0) {
    (**(code **)(*pp_Var4 + 0x10))();
  }
  local_170 = &local_218;
  if (local_218 != (long *)0x0) {
    (**(code **)(*local_218 + 0x18))();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"vertex",&local_259);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
                 *)in_stack_fffffffffffffae0,(key_type *)in_stack_fffffffffffffad8);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  local_238 = pmVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"x",&local_289);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
           ::at(in_stack_fffffffffffffae0,(key_type *)in_stack_fffffffffffffad8);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  local_268 = pmVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"y",&local_2b9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
           ::at(in_stack_fffffffffffffae0,(key_type *)in_stack_fffffffffffffad8);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  local_298 = pmVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"z",&local_2e9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
           ::at(in_stack_fffffffffffffae0,(key_type *)in_stack_fffffffffffffad8);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  local_130 = &local_210;
  local_2c8 = pmVar6;
  pvVar7 = std::
           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         *)(local_210 + 0xe),0);
  local_98 = local_238->size;
  local_128 = local_98;
  local_120 = pvVar7;
  local_38 = local_98;
  local_30 = pvVar7;
  if (pvVar7->size_alloced < local_98) {
    local_28 = local_98;
    if (pvVar7->size_alloced != 0) {
      local_40 = pvVar7->size_alloced;
      while (local_40 < local_38) {
        local_50[1] = 1;
        local_50[0] = local_40 << 1;
        puVar8 = std::max<unsigned_long>(local_50 + 1,local_50);
        local_40 = *puVar8;
      }
      local_28 = local_40;
    }
  }
  else {
    local_28 = pvVar7->size_alloced;
  }
  local_a0 = local_28;
  uVar2 = local_98;
  if (local_98 < pvVar7->size_active) {
    while (local_a8 = uVar2, local_a8 < pvVar7->size_active) {
      uVar2 = local_a8 + 1;
    }
    pvVar7->size_active = local_98;
  }
  local_90 = pvVar7;
  if (local_28 == pvVar7->size_alloced) {
    for (local_b0 = pvVar7->size_active; local_b0 < local_98; local_b0 = local_b0 + 1) {
      local_20 = pvVar7->items + local_b0;
    }
    pvVar7->size_active = local_98;
  }
  else {
    local_b8 = pvVar7->items;
    local_88 = local_28;
    local_80 = pvVar7;
    pVVar9 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffffac8,(size_t)in_stack_fffffffffffffac0);
    pvVar7->items = pVVar9;
    for (local_c0 = 0; local_c0 < pvVar7->size_active; local_c0 = local_c0 + 1) {
      local_70 = pvVar7->items + local_c0;
      local_78 = local_b8 + local_c0;
      uVar1 = *(undefined8 *)((long)&local_78->field_0 + 8);
      *(undefined8 *)&local_70->field_0 = *(undefined8 *)&local_78->field_0;
      *(undefined8 *)((long)&local_70->field_0 + 8) = uVar1;
    }
    for (local_c8 = pvVar7->size_active; local_c8 < local_98; local_c8 = local_c8 + 1) {
      local_18 = pvVar7->items + local_c8;
    }
    local_68 = pvVar7->size_alloced;
    local_60 = local_b8;
    local_58 = pvVar7;
    alignedFree(in_stack_fffffffffffffab8);
    pvVar7->size_active = local_98;
    pvVar7->size_alloced = local_a0;
  }
  for (local_2f8 = 0; local_2f8 < local_238->size; local_2f8 = local_2f8 + 1) {
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](local_268,local_2f8);
    vVar14 = *pvVar10;
    local_138 = &local_210;
    local_f0 = std::
               vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             *)(local_210 + 0xe),0);
    local_f8 = local_2f8;
    local_f0->items[local_2f8].field_0.m128[0] = vVar14;
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](local_298,local_2f8);
    vVar14 = *pvVar10;
    local_140 = &local_210;
    local_100 = std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(local_210 + 0xe),0);
    local_108 = local_2f8;
    local_100->items[local_2f8].field_0.m128[1] = vVar14;
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](local_2c8,local_2f8);
    vVar14 = *pvVar10;
    local_148 = &local_210;
    local_110 = std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(local_210 + 0xe),0);
    local_118 = local_2f8;
    local_110->items[local_2f8].field_0.m128[2] = vVar14;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"face",&local_321);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
                 *)in_stack_fffffffffffffae0,(key_type *)in_stack_fffffffffffffad8);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  local_300 = pmVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"vertex_indices",&local_351);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffae0,(key_type *)in_stack_fffffffffffffad8);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  local_330 = pmVar11;
  for (local_360 = 0; uVar2 = local_360,
      sVar12 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::size(local_330), uVar2 < sVar12; local_360 = local_360 + 1) {
    local_368 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](local_330,local_360);
    sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_368);
    if (2 < sVar12) {
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_368,0);
      local_370 = *pvVar13;
      local_378 = 0;
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_368,1);
      local_380 = *pvVar13;
      for (local_388 = 2; uVar2 = local_388,
          sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_368),
          uVar2 < sVar12; local_388 = local_388 + 1) {
        local_378 = local_380;
        pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (local_368,local_388);
        local_380 = *pvVar13;
        local_150 = &local_210;
        TriangleMeshNode::Triangle::Triangle
                  (&local_394,(uint)local_370,(uint)local_378,(uint)local_380);
        std::
        vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
        ::push_back(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      }
    }
  }
  local_e8 = &local_210;
  local_10 = local_210;
  (in_RDI->super_RefCount)._vptr_RefCount = local_210;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_d8 = &local_210;
  if (local_210 != (_func_int **)0x0) {
    (**(code **)(*local_210 + 0x18))();
  }
  local_160 = local_1d0;
  if (local_1d0[0] != (long *)0x0) {
    (**(code **)(*local_1d0[0] + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> import()
      {
        Ref<SceneGraph::MaterialNode> material = new OBJMaterial;
        Ref<SceneGraph::TriangleMeshNode> mesh_o = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),1);
        
        /* convert all vertices */
        const Element& vertices = mesh.elements.at("vertex");
        const std::vector<float>& posx = vertices.data.at("x");
        const std::vector<float>& posy = vertices.data.at("y");
        const std::vector<float>& posz = vertices.data.at("z");
        
        mesh_o->positions[0].resize(vertices.size);
        for (size_t i=0; i<vertices.size; i++) {
          mesh_o->positions[0][i].x = posx[i];
          mesh_o->positions[0][i].y = posy[i];
          mesh_o->positions[0][i].z = posz[i];
        }

        /* convert all faces */
        const Element& faces = mesh.elements.at("face");
        const std::vector<std::vector<size_t> >& polygons = faces.list.at("vertex_indices");
        
        for (size_t j=0; j<polygons.size(); j++)
        {
          const std::vector<size_t>& face = polygons[j];
          if (face.size() < 3) continue;
          
          /* triangulate the face with a triangle fan */
          size_t i0 = face[0], i1 = 0, i2 = face[1];
          for (size_t k=2; k<face.size(); k++) {
            i1 = i2; i2 = face[k];
            mesh_o->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle((unsigned int)i0, (unsigned int)i1, (unsigned int)i2));
          }
        }
        return mesh_o.dynamicCast<SceneGraph::Node>();
      }